

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O3

bool __thiscall
glslang::HlslGrammar::acceptDefaultParameterDeclaration
          (HlslGrammar *this,TType *type,TIntermTyped **node)

{
  HlslToken *loc;
  HlslParseContext *this_00;
  TIntermediate *this_01;
  bool bVar1;
  int iVar2;
  TFunction *function;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_00;
  long lVar4;
  TIntermTyped *pTVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TIntermTyped *pTVar6;
  TIntermTyped *arguments;
  TIntermTyped *local_38;
  
  *node = (TIntermTyped *)0x0;
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokAssign);
  if (!bVar1) {
    return true;
  }
  bVar1 = acceptConditionalExpression(this,node);
  if (bVar1) {
    pTVar5 = *node;
  }
  else {
    bVar1 = acceptInitializer(this,node);
    if (!bVar1) {
      return false;
    }
    loc = &(this->super_HlslTokenStream).token;
    function = HlslParseContext::makeConstructorCall(this->parseContext,&loc->loc,type);
    if (function == (TFunction *)0x0) {
      return false;
    }
    local_38 = (TIntermTyped *)0x0;
    iVar2 = (*((*node)->super_TIntermNode)._vptr_TIntermNode[6])();
    lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 400))
                      ((long *)CONCAT44(extraout_var,iVar2));
    if (0 < (int)((ulong)(*(long *)(lVar3 + 0x10) - *(long *)(lVar3 + 8)) >> 3)) {
      lVar3 = 0;
      do {
        this_00 = this->parseContext;
        iVar2 = (*((*node)->super_TIntermNode)._vptr_TIntermNode[6])();
        lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 400))
                          ((long *)CONCAT44(extraout_var_00,iVar2));
        pTVar5 = (TIntermTyped *)
                 (**(code **)(**(long **)(*(long *)(lVar4 + 8) + lVar3 * 8) + 0x18))();
        HlslParseContext::handleFunctionArgument(this_00,function,&local_38,pTVar5);
        lVar3 = lVar3 + 1;
        iVar2 = (*((*node)->super_TIntermNode)._vptr_TIntermNode[6])();
        lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 400))
                          ((long *)CONCAT44(extraout_var_01,iVar2));
      } while (lVar3 < (int)((ulong)(*(long *)(lVar4 + 0x10) - *(long *)(lVar4 + 8)) >> 3));
    }
    pTVar5 = HlslParseContext::handleFunctionCall(this->parseContext,&loc->loc,function,*node);
    *node = pTVar5;
  }
  if (pTVar5 == (TIntermTyped *)0x0) {
    return false;
  }
  iVar2 = (*(pTVar5->super_TIntermNode)._vptr_TIntermNode[5])();
  if (CONCAT44(extraout_var_02,iVar2) == 0) {
    pTVar5 = *node;
    this_01 = this->intermediate;
    iVar2 = (*(pTVar5->super_TIntermNode)._vptr_TIntermNode[6])(pTVar5);
    pTVar6 = TIntermediate::fold(this_01,(TIntermAggregate *)CONCAT44(extraout_var_03,iVar2));
    *node = pTVar6;
    if (pTVar6 == (TIntermTyped *)0x0 || pTVar5 == pTVar6) {
      (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
        [0x2d])(this->parseContext,&(this->super_HlslTokenStream).token,
                "invalid default parameter value","","");
      return false;
    }
    return true;
  }
  return true;
}

Assistant:

bool HlslGrammar::acceptDefaultParameterDeclaration(const TType& type, TIntermTyped*& node)
{
    node = nullptr;

    // Valid not to have a default_parameter_declaration
    if (!acceptTokenClass(EHTokAssign))
        return true;

    if (!acceptConditionalExpression(node)) {
        if (!acceptInitializer(node))
            return false;

        // For initializer lists, we have to const-fold into a constructor for the type, so build
        // that.
        TFunction* constructor = parseContext.makeConstructorCall(token.loc, type);
        if (constructor == nullptr)  // cannot construct
            return false;

        TIntermTyped* arguments = nullptr;
        for (int i = 0; i < int(node->getAsAggregate()->getSequence().size()); i++)
            parseContext.handleFunctionArgument(constructor, arguments, node->getAsAggregate()->getSequence()[i]->getAsTyped());

        node = parseContext.handleFunctionCall(token.loc, constructor, node);
    }

    if (node == nullptr)
        return false;

    // If this is simply a constant, we can use it directly.
    if (node->getAsConstantUnion())
        return true;

    // Otherwise, it has to be const-foldable.
    TIntermTyped* origNode = node;

    node = intermediate.fold(node->getAsAggregate());

    if (node != nullptr && origNode != node)
        return true;

    parseContext.error(token.loc, "invalid default parameter value", "", "");

    return false;
}